

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2Impl::decomposeAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doDecompose,UnicodeString *safeMiddle
          ,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UChar UVar1;
  UChar UVar2;
  uint8_t trailCC;
  uint8_t uVar3;
  UBool UVar4;
  bool bVar5;
  uint8_t leadCC;
  int iVar6;
  UCPTrie *trie;
  UChar *pUVar7;
  UChar *s;
  
  ReorderingBuffer::copyReorderableSuffixTo(buffer,safeMiddle);
  if (doDecompose != '\0') {
    decompose(this,src,limit,buffer,errorCode);
    return;
  }
  bVar5 = true;
  leadCC = '\0';
  s = src;
  trailCC = '\0';
  while( true ) {
    if (s == limit) break;
    pUVar7 = s + 1;
    UVar1 = *s;
    if ((UVar1 & 0xf800U) == 0xd800) {
      if ((pUVar7 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
         (UVar2 = *pUVar7, (UVar2 & 0xfc00U) != 0xdc00)) {
        trie = this->normTrie;
        iVar6 = trie->dataLength + -1;
      }
      else {
        pUVar7 = s + 2;
        iVar6 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00;
        trie = this->normTrie;
        if (iVar6 < trie->highStart) {
          iVar6 = ucptrie_internalSmallIndex_63(trie,iVar6);
          trie = this->normTrie;
        }
        else {
          iVar6 = trie->dataLength + -2;
        }
      }
    }
    else {
      trie = this->normTrie;
      iVar6 = ((ushort)UVar1 & 0x3f) + (uint)trie->index[(ushort)UVar1 >> 6];
    }
    uVar3 = getCC(this,*(uint16_t *)((long)(trie->data).ptr0 + (long)iVar6 * 2));
    if (uVar3 == '\0') break;
    if (bVar5) {
      leadCC = uVar3;
    }
    bVar5 = false;
    s = pUVar7;
    trailCC = uVar3;
  }
  if (limit == (UChar *)0x0) {
    limit = u_strchr_63(s,L'\0');
  }
  UVar4 = ReorderingBuffer::append
                    (buffer,src,(int32_t)((ulong)((long)s - (long)src) >> 1),'\0',leadCC,trailCC,
                     errorCode);
  if (UVar4 != '\0') {
    ReorderingBuffer::appendZeroCC(buffer,s,limit,errorCode);
    return;
  }
  return;
}

Assistant:

void Normalizer2Impl::decomposeAndAppend(const UChar *src, const UChar *limit,
                                         UBool doDecompose,
                                         UnicodeString &safeMiddle,
                                         ReorderingBuffer &buffer,
                                         UErrorCode &errorCode) const {
    buffer.copyReorderableSuffixTo(safeMiddle);
    if(doDecompose) {
        decompose(src, limit, &buffer, errorCode);
        return;
    }
    // Just merge the strings at the boundary.
    bool isFirst = true;
    uint8_t firstCC = 0, prevCC = 0, cc;
    const UChar *p = src;
    while (p != limit) {
        const UChar *codePointStart = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if ((cc = getCC(norm16)) == 0) {
            p = codePointStart;
            break;
        }
        if (isFirst) {
            firstCC = cc;
            isFirst = false;
        }
        prevCC = cc;
    }
    if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
        limit=u_strchr(p, 0);
    }

    if (buffer.append(src, (int32_t)(p - src), FALSE, firstCC, prevCC, errorCode)) {
        buffer.appendZeroCC(p, limit, errorCode);
    }
}